

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O1

void __thiscall
t_swift_generator::generate_swift_service_client_recv_function_implementation
          (t_swift_generator *this,ostream *out,t_service *tservice,t_function *tfunction,
          bool needs_protocol)

{
  int *piVar1;
  t_struct *ptVar2;
  t_function *ptVar3;
  int iVar4;
  ostream *poVar5;
  long lVar6;
  _Alloc_hider _Var7;
  char *pcVar8;
  pointer pptVar9;
  string resultname;
  string return_type_name;
  string local_78;
  t_function *local_58;
  string local_50;
  
  poVar5 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"private func recv_",0x12);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tfunction->name_)._M_dataplus._M_p,(tfunction->name_)._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(",1);
  local_58 = tfunction;
  if (this->gen_cocoa_ == false) {
    if (needs_protocol) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"on inProtocol: TProtocol",0x18);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,") throws",8);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(out," -> ",4);
      type_name_abi_cxx11_(&local_78,this,tfunction->returntype_,false,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    block_open(this,out);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try inProtocol.readResultMessageBegin() ",0x28);
    _Var7 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    function_result_helper_struct_type_abi_cxx11_
              (&local_78,(t_swift_generator *)_Var7._M_p,tservice,tfunction);
    t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if (((char)iVar4 == '\0') ||
       ((tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      lVar6 = 0xd;
      pcVar8 = "let result = ";
    }
    else {
      lVar6 = 4;
      pcVar8 = "_ = ";
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,pcVar8,lVar6);
    type_name_abi_cxx11_(&local_50,this,tfunction->returntype_,false,false);
    std::__ostream_insert<char,std::char_traits<char>>(out,"try ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,".read(from: inProtocol)",0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try inProtocol.readMessageEnd()",0x1f);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"if let success = result.success",0x1f);
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return success",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      block_close(this,out,true);
    }
    ptVar2 = tfunction->xceptions_;
    pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if let ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = result.",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,((*pptVar9)->name_)._M_string_length)
        ;
        block_open(this,out);
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"throw ",6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        block_close(this,out,true);
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    ptVar3 = local_58;
    iVar4 = (*(local_58->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"throw TApplicationError(error: .missingResult(methodName: \"",0x3b);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"))",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    if (needs_protocol) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"__inProtocol: TProtocol",0x17);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,") throws",8);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>(out," -> ",4);
      type_name_abi_cxx11_(&local_78,this,tfunction->returntype_,false,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (out,local_78._M_dataplus._M_p,local_78._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
    }
    block_open(this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try __inProtocol.readResultMessageBegin() ",0x2a);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    _Var7 = ::endl_abi_cxx11_._M_dataplus;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    function_result_helper_struct_type_abi_cxx11_
              (&local_78,(t_swift_generator *)_Var7._M_p,tservice,tfunction);
    t_generator::indent((t_generator *)this,out);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if (((char)iVar4 == '\0') ||
       ((tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        (tfunction->xceptions_->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
        _M_impl.super__Vector_impl_data._M_finish)) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"let __result = ",0xf);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"try ",4);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,local_78._M_dataplus._M_p,local_78._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,".readValueFromProtocol(__inProtocol)",0x24);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar5 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"try __inProtocol.readMessageEnd()",0x21);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    iVar4 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"if let __success = __result.success",0x23);
      block_open(this,out);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return __success",0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      block_close(this,out,true);
    }
    ptVar2 = tfunction->xceptions_;
    pptVar9 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pptVar9 !=
        (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if let ",7);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," = __result.",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,((*pptVar9)->name_)._M_string_length)
        ;
        block_open(this,out);
        poVar5 = t_generator::indent((t_generator *)this,out);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"throw ",6);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,((*pptVar9)->name_)._M_dataplus._M_p,
                            ((*pptVar9)->name_)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        block_close(this,out,true);
        pptVar9 = pptVar9 + 1;
      } while (pptVar9 !=
               (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    ptVar3 = local_58;
    iVar4 = (*(local_58->returntype_->super_t_doc)._vptr_t_doc[4])();
    if ((char)iVar4 == '\0') {
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"throw NSError(",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"domain: TApplicationErrorDomain, ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"code: Int(TApplicationError.MissingResult.rawValue),",0x34);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      poVar5 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,"userInfo: [TApplicationErrorMethodKey: \"",0x28);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(ptVar3->name_)._M_dataplus._M_p,(ptVar3->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"])",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  block_close(this,out,true);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_swift_generator::generate_swift_service_client_recv_function_implementation(ostream& out,
                                                                                   t_service* tservice,
                                                                                   t_function* tfunction,
                                                                                   bool needs_protocol) {

  // Open function
  indent(out) << "private func recv_" << tfunction->get_name() << "(";
  if (!gen_cocoa_) {
    if (needs_protocol) {
      out << "on inProtocol: TProtocol";
    }
    out << ") throws";
    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception

    indent(out) << "try inProtocol.readResultMessageBegin() " << endl;

    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let result = ";
    } else {
      out << "_ = ";
    }

    string return_type_name = type_name(tfunction->get_returntype());
    out << "try " << resultname << ".read(from: inProtocol)" << endl;

    indent(out) << "try inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let success = result.success";
      block_open(out);
      indent(out) << "return success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw TApplicationError(error: .missingResult(methodName: \""
                  << tfunction->get_name() << "\"))" << endl;
    }
  } else {
    if (needs_protocol) {
      out << "__inProtocol: TProtocol";
    }

    out << ") throws";

    if (!tfunction->get_returntype()->is_void()) {
      out << " -> " << type_name(tfunction->get_returntype());
    }

    block_open(out);

    // check for an exception
    out << endl;
    indent(out) << "try __inProtocol.readResultMessageBegin() " << endl << endl;
    string resultname = function_result_helper_struct_type(tservice, tfunction);
    indent(out);
    if (!tfunction->get_returntype()->is_void() || !tfunction->get_xceptions()->get_members().empty()) {
      out << "let __result = ";
    }
    out << "try " << resultname << ".readValueFromProtocol(__inProtocol)" << endl << endl;

    indent(out) << "try __inProtocol.readMessageEnd()" << endl << endl;

    // Careful, only return _result if not a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "if let __success = __result.success";
      block_open(out);
      indent(out) << "return __success" << endl;
      block_close(out);
    }

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();
    vector<t_field*>::const_iterator x_iter;

    for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter) {
      indent(out) << "if let " << (*x_iter)->get_name() << " = __result." << (*x_iter)->get_name();
      block_open(out);
      indent(out) << "throw " << (*x_iter)->get_name() << endl;
      block_close(out);
    }

    // If you get here it's an exception, unless a void function
    if (!tfunction->get_returntype()->is_void()) {
      indent(out) << "throw NSError(" << endl;
      indent_up();
      indent(out) << "domain: TApplicationErrorDomain, " << endl;
      indent(out) << "code: Int(TApplicationError.MissingResult.rawValue)," << endl;
      indent(out) << "userInfo: [TApplicationErrorMethodKey: \"" << tfunction->get_name() << "\"])" << endl;
      indent_down();
    }
  }

  // Close function
  block_close(out);
  out << endl;
}